

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * pack31_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * -0x80000000 | uVar1 - base;
  uVar2 = in[1] - base >> 1;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x40000000 | uVar2;
  uVar2 = in[2] - base >> 2;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x20000000 | uVar2;
  uVar2 = in[3] - base >> 3;
  out[3] = uVar2;
  out[3] = (in[4] - base) * 0x10000000 | uVar2;
  uVar2 = in[4] - base >> 4;
  out[4] = uVar2;
  out[4] = (in[5] - base) * 0x8000000 | uVar2;
  uVar2 = in[5] - base >> 5;
  out[5] = uVar2;
  out[5] = (in[6] - base) * 0x4000000 | uVar2;
  uVar2 = in[6] - base >> 6;
  out[6] = uVar2;
  out[6] = (in[7] - base) * 0x2000000 | uVar2;
  uVar2 = in[7] - base >> 7;
  out[7] = uVar2;
  out[7] = (in[8] - base) * 0x1000000 | uVar2;
  uVar2 = in[8] - base >> 8;
  out[8] = uVar2;
  out[8] = (in[9] - base) * 0x800000 | uVar2;
  uVar2 = in[9] - base >> 9;
  out[9] = uVar2;
  out[9] = (in[10] - base) * 0x400000 | uVar2;
  uVar2 = in[10] - base >> 10;
  out[10] = uVar2;
  out[10] = (in[0xb] - base) * 0x200000 | uVar2;
  uVar2 = in[0xb] - base >> 0xb;
  out[0xb] = uVar2;
  out[0xb] = (in[0xc] - base) * 0x100000 | uVar2;
  uVar2 = in[0xc] - base >> 0xc;
  out[0xc] = uVar2;
  out[0xc] = (in[0xd] - base) * 0x80000 | uVar2;
  uVar2 = in[0xd] - base >> 0xd;
  out[0xd] = uVar2;
  out[0xd] = (in[0xe] - base) * 0x40000 | uVar2;
  uVar2 = in[0xe] - base >> 0xe;
  out[0xe] = uVar2;
  out[0xe] = (in[0xf] - base) * 0x20000 | uVar2;
  out[0xf] = in[0xf] - base >> 0xf;
  return out + 0x10;
}

Assistant:

uint32_t * pack31_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  30 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  29 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  28 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  27 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  26 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  25 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  24 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  23 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  21 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  16 );
    ++in;

    return out + 1;
}